

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
ipx::Model::DualizeBasicSolution
          (Model *this,Vector *x_user,Vector *slack_user,Vector *y_user,Vector *z_user,
          Vector *x_solver,Vector *y_solver,Vector *z_solver)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  double *pdVar5;
  double *pdVar6;
  int *piVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  _Expr<std::__detail::_UnClos<std::__negate,_std::_ValArray,_double>,_double> local_38;
  
  uVar1 = this->num_rows_;
  uVar12 = (ulong)uVar1;
  uVar2 = this->num_cols_;
  lVar13 = (long)(int)uVar2;
  if (this->dualized_ == true) {
    local_38._M_closure.super__UnBase<std::__negate,_std::valarray<double>_>._M_expr =
         (_UnClos<std::__negate,_std::_ValArray,_double>)
         (_UnClos<std::__negate,_std::_ValArray,_double>)x_user;
    std::valarray<double>::operator=(y_solver,&local_38);
    uVar2 = this->num_constr_;
    pdVar6 = slack_user->_M_data;
    pdVar5 = z_solver->_M_data;
    uVar8 = 0;
    uVar10 = 0;
    if (0 < (int)uVar2) {
      uVar10 = (ulong)uVar2;
    }
    for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
      pdVar5[uVar8] = -pdVar6[uVar8];
    }
    piVar3 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar6 = (this->c_)._M_data;
    piVar4 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = y_solver->_M_data;
    pdVar9 = z_solver->_M_data;
    for (lVar11 = 0; (long)piVar3 - (long)piVar4 >> 2 != lVar11; lVar11 = lVar11 + 1) {
      pdVar9[(int)uVar2 + lVar11] = pdVar6[(int)(uVar2 + (int)lVar11)] + pdVar5[piVar4[lVar11]];
    }
    pdVar6 = y_solver->_M_data;
    uVar8 = 0;
    if ((int)uVar1 < 1) {
      uVar12 = uVar8;
    }
    pdVar5 = (this->c_)._M_data;
    pdVar9 = z_solver->_M_data;
    for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      pdVar9[lVar13 + uVar8] = pdVar5[lVar13 + uVar8] - pdVar6[uVar8];
    }
    if (0 < (int)uVar2) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar5 = (double *)y_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = y_user->_M_data;
      }
      memmove(pdVar6,pdVar5,(long)(int)uVar2 * 8);
    }
    if (0 < (long)this->num_var_) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar5 = (double *)z_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = z_user->_M_data;
      }
      memmove(pdVar6 + lVar13,pdVar5,(long)this->num_var_ << 3);
    }
    piVar7 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
    pdVar5 = x_solver->_M_data;
    pdVar6 = pdVar5 + this->num_constr_;
    while (bVar14 = lVar11 != 0, lVar11 = lVar11 + -1, bVar14) {
      pdVar9 = pdVar6;
      if (pdVar5[*piVar7 + lVar13] < 0.0) {
        pdVar9 = pdVar5 + *piVar7 + lVar13;
        *pdVar6 = -pdVar5[*piVar7 + lVar13];
      }
      *pdVar9 = 0.0;
      pdVar6 = pdVar6 + 1;
      piVar7 = piVar7 + 1;
    }
  }
  else {
    if (0 < (int)uVar2) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar5 = (double *)x_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = x_user->_M_data;
      }
      memmove(pdVar6,pdVar5,(ulong)uVar2 * 8);
    }
    if (0 < (int)uVar1) {
      pdVar6 = (double *)x_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = x_solver->_M_data;
      }
      pdVar5 = (double *)slack_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = slack_user->_M_data;
      }
      memmove(pdVar6 + lVar13,pdVar5,uVar12 * 8);
      pdVar6 = (double *)y_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = y_solver->_M_data;
      }
      pdVar5 = (double *)y_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = y_user->_M_data;
      }
      memmove(pdVar6,pdVar5,uVar12 * 8);
    }
    if (0 < (int)uVar2) {
      pdVar6 = (double *)z_solver->_M_size;
      if (pdVar6 != (double *)0x0) {
        pdVar6 = z_solver->_M_data;
      }
      pdVar5 = (double *)z_user->_M_size;
      if (pdVar5 != (double *)0x0) {
        pdVar5 = z_user->_M_data;
      }
      memmove(pdVar6,pdVar5,lVar13 * 8);
    }
    pdVar6 = y_solver->_M_data;
    uVar8 = 0;
    if ((int)uVar1 < 1) {
      uVar12 = uVar8;
    }
    pdVar5 = (this->c_)._M_data;
    pdVar9 = z_solver->_M_data;
    for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      pdVar9[lVar13 + uVar8] = pdVar5[lVar13 + uVar8] - pdVar6[uVar8];
    }
  }
  return;
}

Assistant:

void Model::DualizeBasicSolution(const Vector& x_user,
                                 const Vector& slack_user,
                                 const Vector& y_user,
                                 const Vector& z_user,
                                 Vector& x_solver,
                                 Vector& y_solver,
                                 Vector& z_solver) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + boxed_vars_.size() == static_cast<size_t>(n));

        // Build dual solver variables from primal user variables.
        y_solver = -x_user;
        for (Int i = 0; i < num_constr_; i++)
            z_solver[i] = -slack_user[i];
        for (size_t k = 0; k < boxed_vars_.size(); k++) {
            Int j = boxed_vars_[k];
            z_solver[num_constr_+k] = c(num_constr_+k) + y_solver[j];
        }
        for (Int i = 0; i < m; i++)
            z_solver[n+i] = c(n+i)-y_solver[i];

        // Build primal solver variables from dual user variables.
        std::copy_n(std::begin(y_user), num_constr_, std::begin(x_solver));
        std::copy_n(std::begin(z_user), num_var_, std::begin(x_solver) + n);
        for (size_t k = 0; k < boxed_vars_.size(); k++) {
            Int j = boxed_vars_[k];
            if (x_solver[n+j] < 0.0) {
                // j is a boxed variable and z_user[j] < 0
                x_solver[num_constr_+k] = -x_solver[n+j];
                x_solver[n+j] = 0.0;
            } else {
                x_solver[num_constr_+k] = 0.0;
            }
        }
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_user), n, std::begin(x_solver));
        std::copy_n(std::begin(slack_user), m, std::begin(x_solver) + n);
        std::copy_n(std::begin(y_user), m, std::begin(y_solver));
        std::copy_n(std::begin(z_user), n, std::begin(z_solver));
        for (Int i = 0; i < m; i++)
            z_solver[n+i] = c(n+i)-y_solver[i];
    }
}